

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall
duckdb::JoinFilterPushdownInfo::Sink
          (JoinFilterPushdownInfo *this,DataChunk *chunk,JoinFilterLocalState *lstate)

{
  idx_t payload_idx;
  const_reference pvVar1;
  pointer this_00;
  size_type __n;
  idx_t i;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  for (__n = 0; __n < (ulong)((long)(this->join_condition).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->join_condition).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar1 = vector<unsigned_long,_true>::get<true>(&this->join_condition,__n);
    payload_idx = *pvVar1;
    for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
      this_00 = unique_ptr<duckdb::LocalUngroupedAggregateState,_std::default_delete<duckdb::LocalUngroupedAggregateState>,_true>
                ::operator->(&lstate->local_aggregate_state);
      LocalUngroupedAggregateState::Sink(this_00,chunk,payload_idx,lVar3 + lVar2);
    }
    lVar3 = lVar3 + 2;
  }
  return;
}

Assistant:

void JoinFilterPushdownInfo::Sink(DataChunk &chunk, JoinFilterLocalState &lstate) const {
	// if we are pushing any filters into a probe-side, compute the min/max over the columns that we are pushing
	for (idx_t pushdown_idx = 0; pushdown_idx < join_condition.size(); pushdown_idx++) {
		auto join_condition_idx = join_condition[pushdown_idx];
		for (idx_t i = 0; i < 2; i++) {
			idx_t aggr_idx = pushdown_idx * 2 + i;
			lstate.local_aggregate_state->Sink(chunk, join_condition_idx, aggr_idx);
		}
	}
}